

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(void)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  int iVar3;
  long in_FS_OFFSET;
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  threads;
  Tracing context;
  CallbackQueue queue;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  undefined8 *local_208;
  undefined8 uStack_200;
  code *local_1f8;
  code *pcStack_1f0;
  undefined8 *local_1e8;
  undefined8 uStack_1e0;
  code *local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c8;
  undefined8 uStack_1c0;
  code *local_1b8;
  undefined8 uStack_1b0;
  _List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  local_1a8;
  _Any_data local_190;
  code *local_180;
  string local_170;
  _Any_data local_150;
  code *local_140;
  Tracing local_130;
  CallbackQueue local_e0;
  
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"main","");
  demo::Tracing::Tracing(&local_130,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  iVar3 = 0;
  capture_thread::testing::CallbackQueue::CallbackQueue(&local_e0,false);
  do {
    local_1d8 = (code *)0x0;
    uStack_1d0 = 0;
    local_1e8 = (undefined8 *)0x0;
    uStack_1e0 = 0;
    local_228._M_unused._M_object = operator_new(0x10);
    *(code **)local_228._M_unused._0_8_ = anon_unknown.dwarf_91e4::Compute;
    *(int *)((long)local_228._M_unused._0_8_ + 8) = iVar3;
    local_210 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_invoke;
    local_228._8_8_ = uStack_1e0;
    local_218 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_manager;
    local_1d8 = (code *)0x0;
    uStack_1d0 = 0;
    local_1e8 = (undefined8 *)local_228._M_unused._0_8_;
    capture_thread::ThreadCrosser::WrapFunction<void>
              ((function<void_()> *)&local_190,(function<void_()> *)&local_228);
    if (local_218 != (code *)0x0) {
      (*local_218)(&local_228,&local_228,__destroy_functor);
    }
    capture_thread::testing::CallbackQueue::Push(&local_e0,(function<void_()> *)&local_190);
    if (local_180 != (code *)0x0) {
      (*local_180)(&local_190,&local_190,__destroy_functor);
    }
    if (local_1d8 != (code *)0x0) {
      (*local_1d8)(&local_1e8,&local_1e8,3);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  local_1a8._M_impl._M_node._M_size = 0;
  iVar3 = 0;
  local_1a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1a8;
  local_1a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_1a8;
  do {
    local_1f8 = (code *)0x0;
    pcStack_1f0 = (code *)0x0;
    local_208 = (undefined8 *)0x0;
    uStack_200 = 0;
    local_208 = (undefined8 *)operator_new(0x18);
    *local_208 = anon_unknown.dwarf_91e4::QueueThread;
    local_208[1] = &local_e0;
    *(int *)(local_208 + 2) = iVar3;
    pcStack_1f0 = std::
                  _Function_handler<void_(),_std::_Bind<void_(*(int,_capture_thread::testing::CallbackQueue_*))(int,_capture_thread::testing::CallbackQueue_*)>_>
                  ::_M_invoke;
    local_1f8 = std::
                _Function_handler<void_(),_std::_Bind<void_(*(int,_capture_thread::testing::CallbackQueue_*))(int,_capture_thread::testing::CallbackQueue_*)>_>
                ::_M_manager;
    p_Var1 = (_List_node_base *)operator_new(8);
    local_1c8 = local_208;
    uStack_1c0 = uStack_200;
    local_1f8 = (code *)0x0;
    pcStack_1f0 = (code *)0x0;
    local_210 = std::
                _Function_handler<void_(),_std::_Bind<void_(*(int,_capture_thread::testing::CallbackQueue_*))(int,_capture_thread::testing::CallbackQueue_*)>_>
                ::_M_invoke;
    local_228._M_unused._M_object = local_208;
    local_228._8_8_ = uStack_200;
    local_218 = std::
                _Function_handler<void_(),_std::_Bind<void_(*(int,_capture_thread::testing::CallbackQueue_*))(int,_capture_thread::testing::CallbackQueue_*)>_>
                ::_M_manager;
    local_1b8 = (code *)0x0;
    uStack_1b0 = 0;
    capture_thread::ThreadCrosser::WrapFunction<void>
              ((function<void_()> *)&local_150,(function<void_()> *)&local_228);
    if (local_218 != (code *)0x0) {
      (*local_218)(&local_228,&local_228,__destroy_functor);
    }
    std::thread::thread<std::function<void()>,,void>
              ((thread *)p_Var1,(function<void_()> *)&local_150);
    if (local_140 != (code *)0x0) {
      (*local_140)(&local_150,&local_150,__destroy_functor);
    }
    if (local_1b8 != (code *)0x0) {
      (*local_1b8)(&local_1c8,&local_1c8,3);
    }
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = p_Var1;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    local_1a8._M_impl._M_node._M_size = local_1a8._M_impl._M_node._M_size + 1;
    if (local_1f8 != (code *)0x0) {
      (*local_1f8)(&local_208,&local_208,3);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  capture_thread::testing::CallbackQueue::Activate(&local_e0);
  capture_thread::testing::CallbackQueue::WaitUntilEmpty(&local_e0);
  capture_thread::testing::CallbackQueue::Terminate(&local_e0);
  p_Var1 = (_List_node_base *)&local_1a8;
  while (p_Var1 = (((_List_impl *)&p_Var1->_M_next)->_M_node).super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&local_1a8) {
    std::thread::join();
  }
  std::__cxx11::
  _List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::_M_clear(&local_1a8);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&local_e0.queue_.c);
  std::condition_variable::~condition_variable(&local_e0.condition_);
  local_130.super_ThreadCapture<demo::Tracing>._vptr_ThreadCapture =
       (_func_int **)&PTR__Tracing_0010bb70;
  local_130.cross_and_capture_to_.super_ThreadCrosser._vptr_ThreadCrosser =
       (_func_int **)&PTR__AutoThreadCrosser_0010bbb8;
  *(Tracing **)(in_FS_OFFSET + -0x18) = local_130.cross_and_capture_to_.capture_to_.previous_;
  capture_thread::ThreadCrosser::SetCurrent(local_130.cross_and_capture_to_.cross_with_.parent_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.name_._M_dataplus._M_p != &local_130.name_.field_2) {
    operator_delete(local_130.name_._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {
  Tracing context(__func__);

  // Queue for passing work from the main thread to the worker threads. Created
  // in a paused state.
  CallbackQueue queue(false /*active*/);

  for (int i = 0; i < 10; ++i) {
    // One callback per unit of work that can be parallelized.
    queue.Push(ThreadCrosser::WrapCall(std::bind(&Compute, i)));
  }

  std::list<std::unique_ptr<std::thread>> threads;
  for (int i = 0; i < 3; ++i) {
    // An arbitrary number of threads.
    threads.emplace_back(NewThread(std::bind(&QueueThread, i, &queue)));
  }

  // Perform the computations.

  queue.Activate();
  queue.WaitUntilEmpty();
  queue.Terminate();

  for (const auto& thread : threads) {
    thread->join();
  }
}